

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O3

void __thiscall adios2::transport::FileRemote::~FileRemote(FileRemote *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Remote *pRVar2;
  
  (this->super_Transport)._vptr_Transport = (_func_int **)&PTR__FileRemote_00874270;
  if ((this->super_Transport).m_IsOpen == true) {
    Close(this);
  }
  pcVar1 = (this->m_CachePath)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_CachePath).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_FileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_FileName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_Hostname)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_Hostname).field_2) {
    operator_delete(pcVar1);
  }
  this_00 = (this->m_OpenFuture).super___basic_future<int>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pRVar2 = (this->m_Remote)._M_t.
           super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
           super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
           super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
  if (pRVar2 != (Remote *)0x0) {
    (*pRVar2->_vptr_Remote[1])();
  }
  (this->m_Remote)._M_t.super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>.
  _M_t.super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
  super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl = (Remote *)0x0;
  Transport::~Transport(&this->super_Transport);
  return;
}

Assistant:

FileRemote::~FileRemote()
{
    if (m_IsOpen)
    {
        Close();
    }
}